

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int implode_callback(jx9_value *pKey,jx9_value *pValue,void *pUserData)

{
  int iVar1;
  int local_3c;
  char *pcStack_38;
  int nLen;
  char *zData;
  implode_data *pData;
  void *pUserData_local;
  jx9_value *pValue_local;
  jx9_value *pKey_local;
  
  zData = (char *)pUserData;
  pData = (implode_data *)pUserData;
  pUserData_local = pValue;
  pValue_local = pKey;
  if (((*(int *)((long)pUserData + 8) == 0) || (iVar1 = jx9_value_is_json_array(pValue), iVar1 == 0)
      ) || (0x1f < *(int *)(zData + 0x20))) {
    pcStack_38 = jx9_value_to_string((jx9_value *)pUserData_local,&local_3c);
    if (0 < local_3c) {
      if (0 < *(int *)(zData + 0x18)) {
        if (*(int *)(zData + 0x1c) == 0) {
          jx9_result_string(*(jx9_context **)zData,*(char **)(zData + 0x10),*(int *)(zData + 0x18));
        }
        else {
          zData[0x1c] = '\0';
          zData[0x1d] = '\0';
          zData[0x1e] = '\0';
          zData[0x1f] = '\0';
        }
      }
      jx9_result_string(*(jx9_context **)zData,pcStack_38,local_3c);
    }
  }
  else {
    if (0 < *(int *)(zData + 0x18)) {
      if (*(int *)(zData + 0x1c) == 0) {
        jx9_result_string(*(jx9_context **)zData,*(char **)(zData + 0x10),*(int *)(zData + 0x18));
      }
      else {
        zData[0x1c] = '\0';
        zData[0x1d] = '\0';
        zData[0x1e] = '\0';
        zData[0x1f] = '\0';
      }
    }
    zData[0x1c] = '\x01';
    zData[0x1d] = '\0';
    zData[0x1e] = '\0';
    zData[0x1f] = '\0';
    *(int *)(zData + 0x20) = *(int *)(zData + 0x20) + 1;
    jx9HashmapWalk(*pUserData_local,implode_callback,zData);
    *(int *)(zData + 0x20) = *(int *)(zData + 0x20) + -1;
  }
  return 0;
}

Assistant:

static int implode_callback(jx9_value *pKey, jx9_value *pValue, void *pUserData)
{
	struct implode_data *pData = (struct implode_data *)pUserData;
	const char *zData;
	int nLen;
	if( pData->bRecursive && jx9_value_is_json_array(pValue) && pData->nRecCount < 32 ){
		if( pData->nSeplen > 0 ){
			if( !pData->bFirst ){
				/* append the separator first */
				jx9_result_string(pData->pCtx, pData->zSep, pData->nSeplen);
			}else{
				pData->bFirst = 0;
			}
		}
		/* Recurse */
		pData->bFirst = 1;
		pData->nRecCount++;
		jx9HashmapWalk((jx9_hashmap *)pValue->x.pOther, implode_callback, pData);
		pData->nRecCount--;
		return JX9_OK;
	}
	/* Extract the string representation of the entry value */
	zData = jx9_value_to_string(pValue, &nLen);
	if( nLen > 0 ){
		if( pData->nSeplen > 0 ){
			if( !pData->bFirst ){
				/* append the separator first */
				jx9_result_string(pData->pCtx, pData->zSep, pData->nSeplen);
			}else{
				pData->bFirst = 0;
			}
		}
		jx9_result_string(pData->pCtx, zData, nLen);
	}else{
		SXUNUSED(pKey); /* cc warning */
	}
	return JX9_OK;
}